

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

mu_Id mu_get_id(mu_Context *ctx,void *data,int size)

{
  mu_Id local_24;
  int local_20;
  mu_Id res;
  int idx;
  int size_local;
  void *data_local;
  mu_Context *ctx_local;
  
  local_20 = (ctx->id_stack).idx;
  if (local_20 < 1) {
    local_24 = 0x811c9dc5;
  }
  else {
    local_24 = (ctx->id_stack).items[local_20 + -1];
  }
  res = size;
  _idx = data;
  data_local = ctx;
  hash(&local_24,data,size);
  *(mu_Id *)((long)data_local + 0x88) = local_24;
  return local_24;
}

Assistant:

mu_Id mu_get_id(mu_Context *ctx, const void *data, int size) {
  int idx = ctx->id_stack.idx;
  mu_Id res = (idx > 0) ? ctx->id_stack.items[idx - 1] : HASH_INITIAL;
  hash(&res, data, size);
  ctx->last_id = res;
  return res;
}